

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O1

void __thiscall RK_Individual::calculate_fitness(RK_Individual *this,Graph *graph,bool theBest)

{
  int iVar1;
  Vertex *pVVar2;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  __first;
  iterator __last;
  RK_Individual *pRVar3;
  ulong uVar4;
  Edge *pEVar5;
  double *pdVar6;
  double *pdVar7;
  undefined7 in_register_00000011;
  Vertex *pVVar8;
  long lVar9;
  Vertex *pVVar10;
  int iVar11;
  int iVar12;
  vector<Chromosome_*,_std::allocator<Chromosome_*>_> chromosomes;
  Chromosome *chromosome;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  local_68;
  iterator iStack_60;
  Chromosome **local_58;
  undefined4 local_44;
  RK_Individual *local_40;
  Chromosome *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,theBest);
  local_68._M_current = (Chromosome **)0x0;
  iStack_60._M_current = (Chromosome **)0x0;
  local_58 = (Chromosome **)0x0;
  pVVar8 = graph->verticesList;
  local_40 = this;
  if (pVVar8 != (Vertex *)0x0) {
    do {
      for (pEVar5 = pVVar8->edgesList; pEVar5 != (Edge *)0x0; pEVar5 = pEVar5->nextEdge) {
        if ((pEVar5->modifiable == true) && (pEVar5->marked == true)) {
          local_38 = (Chromosome *)operator_new(0x18);
          local_38->edge = (Edge *)0x0;
          local_38->weight = 0.0;
          *(undefined8 *)&local_38->position = 0;
          local_38->edge = pEVar5;
          local_38->weight = 0.0;
          if (iStack_60._M_current == local_58) {
            std::vector<Chromosome*,std::allocator<Chromosome*>>::
            _M_realloc_insert<Chromosome*const&>
                      ((vector<Chromosome*,std::allocator<Chromosome*>> *)&local_68,iStack_60,
                       &local_38);
          }
          else {
            *iStack_60._M_current = local_38;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
      }
      pVVar8 = pVVar8->nextVertex;
    } while (pVVar8 != (Vertex *)0x0);
  }
  pRVar3 = local_40;
  __last._M_current = iStack_60._M_current;
  __first._M_current = local_68._M_current;
  iVar11 = local_40->number_of_edges;
  if (0 < (long)iVar11) {
    pdVar6 = local_40->weights;
    lVar9 = 0;
    do {
      local_68._M_current[lVar9]->weight = pdVar6[lVar9];
      lVar9 = lVar9 + 1;
    } while (iVar11 != lVar9);
  }
  if (local_68._M_current != iStack_60._M_current) {
    uVar4 = (long)iStack_60._M_current - (long)local_68._M_current >> 3;
    lVar9 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
              (local_68,(__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                         )iStack_60._M_current,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x105594);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
              (__first,(__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                        )__last._M_current,
               (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x105594);
  }
  iVar11 = ~graph->numberOfNonModifiable + graph->verticesSize;
  for (pVVar8 = graph->verticesList; pVVar8 != (Vertex *)0x0; pVVar8 = pVVar8->nextVertex) {
    for (pEVar5 = pVVar8->edgesList; pEVar5 != (Edge *)0x0; pEVar5 = pEVar5->nextEdge) {
      pEVar5->closed = (bool)(pEVar5->modifiable ^ 1);
      pEVar5->activePowerFlow = 0.0;
      pEVar5->reactivePowerFlow = 0.0;
      pEVar5->activeLoss = 0.0;
      pEVar5->reactiveLoss = 0.0;
    }
  }
  Graph::resetIDTree(graph);
  if (0 < iVar11) {
    uVar4 = 0;
    iVar12 = 0;
    do {
      if ((ulong)((long)iStack_60._M_current - (long)local_68._M_current >> 3) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      pEVar5 = local_68._M_current[uVar4]->edge;
      pVVar8 = pEVar5->origin;
      pVVar2 = pEVar5->destiny;
      iVar1 = pVVar8->idTree;
      if ((iVar1 != pVVar2->idTree) && (pEVar5->closed == false)) {
        for (pVVar10 = graph->verticesList; pVVar10 != (Vertex *)0x0; pVVar10 = pVVar10->nextVertex)
        {
          if (pVVar10->idTree == iVar1) {
            pVVar10->idTree = pVVar2->idTree;
          }
        }
        pEVar5->closed = true;
        pEVar5 = Graph::findEdge(graph,pVVar2->id,pVVar8->id);
        pEVar5->closed = true;
        iVar12 = iVar12 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (iVar12 < iVar11);
  }
  Graph::defineFlows(graph);
  Graph::capacitor_allocation(graph);
  Graph::evaluateLossesAndFlows(graph,1e-08,0);
  pdVar6 = Graph::getLosses(graph);
  pRVar3->active_loss = *pdVar6;
  pRVar3->reactive_loss = pdVar6[1];
  if (NAN(*pdVar6)) {
    pRVar3->active_loss = 9999999999.0;
  }
  if (NAN(pdVar6[1])) {
    pRVar3->reactive_loss = 9999999999.0;
  }
  pdVar7 = Graph::getTotalLoss(graph);
  uVar4 = -(ulong)NAN(pdVar7[1]);
  pRVar3->objective_function = (double)(~uVar4 & (ulong)pdVar7[1] | uVar4 & 0x4202a05f1ff80000);
  operator_delete(pdVar6,8);
  if ((char)local_44 == '\0') {
    for (pVVar8 = graph->verticesList; pVVar8 != (Vertex *)0x0; pVVar8 = pVVar8->nextVertex) {
      Vertex::rm_all_capacitors(pVVar8);
    }
  }
  if (iStack_60._M_current != local_68._M_current) {
    iStack_60._M_current = local_68._M_current;
  }
  if (local_68._M_current != (Chromosome **)0x0) {
    operator_delete(local_68._M_current,(long)local_58 - (long)local_68._M_current);
  }
  return;
}

Assistant:

void RK_Individual::calculate_fitness(Graph *graph , bool theBest ){
    vector<Chromosome*> chromosomes;


    Chromosome *chromosome;
    for( Vertex *vertex = graph->get_verticesList(); vertex!=NULL; vertex = vertex->getNext() ){
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e= e->getNext()){
		if(e->getModifiable() == true && e->getMarked() == true){
            chromosome = new Chromosome();
            chromosome->edge = e;
            chromosome->weight = 0;
            chromosomes.push_back(chromosome);
	        }
	}

    }

    for(int i=0; i < this->number_of_edges; i++) /// Copia peso do individio paca cada cromossomo
        chromosomes[i]->weight = this->weights[i];

    sort(chromosomes.begin(), chromosomes.end(), sortChromosome);

    int inserted_size = 0, toInsert_size = graph->getVerticesSize()-1- graph->getNumberOfNonModifiable();


    for(Vertex *vertex = graph->get_verticesList(); vertex!=NULL; vertex = vertex->getNext()){
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e = e->getNext()){

            //arcos nao modificaveis ficam sempre fechados
            if(e->getModifiable() == false)
                e->setSwitch(true);
            else
                e->setSwitch(false);

            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);
        }
    }

    graph->resetIDTree();                               // reseta os ids de componentes conexas para algoritmo de Kruskal
    for(int i=0; inserted_size<toInsert_size; i++){     // percorre vetor de cromossomos ordenados e tenta fechar chave(algoritmo de kruskal)
        if( (chromosomes.at(i)->edge->getOrigin()->getIdTree() != chromosomes.at(i)->edge->getDestiny()->getIdTree()) &&
                chromosomes.at(i)->edge->isClosed()==false){
            int id = chromosomes.at(i)->edge->getOrigin()->getIdTree();
            for(Vertex *v = graph->get_verticesList(); v!=NULL; v = v->getNext()){
                if(v->getIdTree()==id)
                    v->setIdTree(chromosomes.at(i)->edge->getDestiny()->getIdTree());
            }
            chromosomes.at(i)->edge->setSwitch(true);
            graph->findEdge(chromosomes.at(i)->edge->getDestiny()->getID(), chromosomes.at(i)->edge->getOrigin()->getID())->setSwitch(true);
            inserted_size++;
        }
    }

    graph->defineFlows();

    graph->capacitor_allocation();          // TODO: trocar calculo da funcao objetivo para o custo total (todos niveis) em dinheiro US$

    graph->evaluateLossesAndFlows(1e-8);    // calcula fluxos e perda com erro de 1e-5

    double *losses = graph->getLosses();    // soma as perdas ativas e reativas em todos os arcos e retorna um double

    this->active_loss           = losses[0];
    this->reactive_loss         = losses[1];

    // No caso de solucoes que possuem configuracao viavel porem sao muito longas
    if( isnan(losses[0]) )      this->active_loss   = 9999999999;
    if( isnan(losses[1]) )      this->reactive_loss = 9999999999;

    this->objective_function    = graph->getTotalLoss()[1];
    if(isnan( this->objective_function ) )    this->objective_function = 9999999999;

//    cout << "Perda Total:    " << graph->getTotalLoss()[0] << endl;
//    cout << "Custo Total:    " << graph->getTotalLoss()[1] << endl;

    delete losses;

    if( !theBest )
    for (Vertex *vertex_caps = graph->get_verticesList(); vertex_caps != NULL; vertex_caps = vertex_caps->getNext()) {
        vertex_caps->rm_all_capacitors();
    }

    chromosomes.clear();    // Deletar vetor de cromossomos(nao esta deletando memoria)
}